

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O1

void __thiscall llbuild::core::BuildEngine::dumpGraphToFile(BuildEngine *this,string *path)

{
  BuildEngineImpl *this_00;
  BuildEngineDelegate *pBVar1;
  long lVar2;
  FILE *__s;
  long *plVar3;
  ulong uVar4;
  RuleInfo *pRVar5;
  ulong uVar6;
  size_type *psVar7;
  long lVar8;
  size_t __n;
  long *plVar9;
  long *plVar10;
  __normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_**,_std::vector<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleInfo_*>_>_>
  __i;
  ulong uVar11;
  long *plVar12;
  ulong uVar13;
  long lVar14;
  RuleInfo **ruleInfo;
  _Hash_node_base *p_Var15;
  long *local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Twine local_48;
  
  this_00 = (BuildEngineImpl *)this->impl;
  __s = fopen((path->_M_dataplus)._M_p,"w");
  if (__s == (FILE *)0x0) {
    pBVar1 = this_00->delegate;
    std::operator+(&local_68,"unable to open graph output path \"",path);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
    psVar7 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_88.field_2._M_allocated_capacity = *psVar7;
      local_88.field_2._8_8_ = plVar3[3];
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar7;
      local_88._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_88._M_string_length = plVar3[1];
    *plVar3 = (long)psVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    llvm::Twine::Twine(&local_48,&local_88);
    (*pBVar1->_vptr_BuildEngineDelegate[7])(pBVar1,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    fwrite("digraph llbuild {\n",0x12,1,__s);
    fwrite("rankdir=\"LR\"\n",0xd,1,__s);
    fwrite("node [fontsize=10, shape=box, height=0.25]\n",0x2b,1,__s);
    fwrite("edge [fontsize=10]\n",0x13,1,__s);
    fputc(10,__s);
    p_Var15 = (this_00->ruleInfos)._M_h._M_before_begin._M_nxt;
    if (p_Var15 == (_Hash_node_base *)0x0) {
      local_a8 = (long *)0x0;
      plVar9 = (long *)0x0;
      plVar3 = (long *)0x0;
    }
    else {
      plVar9 = (long *)0x0;
      local_a8 = (long *)0x0;
      plVar10 = (long *)0x0;
      do {
        if (plVar9 == local_a8) {
          __n = (long)plVar9 - (long)plVar10;
          if (__n == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar11 = (long)__n >> 3;
          uVar4 = 1;
          if (plVar9 != plVar10) {
            uVar4 = uVar11;
          }
          uVar6 = uVar4 + uVar11;
          if (0xffffffffffffffe < uVar6) {
            uVar6 = 0xfffffffffffffff;
          }
          uVar13 = 0xfffffffffffffff;
          if (!CARRY8(uVar4,uVar11)) {
            uVar13 = uVar6;
          }
          if (uVar13 == 0) {
            plVar3 = (long *)0x0;
          }
          else {
            plVar3 = (long *)operator_new(uVar13 * 8);
          }
          plVar3[uVar11] = (long)(p_Var15 + 2);
          if (0 < (long)__n) {
            memmove(plVar3,plVar10,__n);
          }
          if (plVar10 != (long *)0x0) {
            operator_delete(plVar10,(long)local_a8 - (long)plVar10);
          }
          plVar9 = (long *)(__n + (long)plVar3);
          local_a8 = plVar3 + uVar13;
        }
        else {
          *plVar9 = (long)(p_Var15 + 2);
          plVar3 = plVar10;
        }
        plVar9 = plVar9 + 1;
        p_Var15 = p_Var15->_M_nxt;
        plVar10 = plVar3;
      } while (p_Var15 != (_Hash_node_base *)0x0);
    }
    if (plVar3 != plVar9) {
      uVar4 = (long)plVar9 - (long)plVar3 >> 3;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const**,std::vector<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::BuildEngineImpl::dumpGraphToFile(std::__cxx11::string_const&)::_lambda((anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*)_1_>>
                (plVar3,plVar9,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      plVar10 = plVar3;
      if ((long)plVar9 - (long)plVar3 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const**,std::vector<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::BuildEngineImpl::dumpGraphToFile(std::__cxx11::string_const&)::_lambda((anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*)_1_>>
                  (plVar3,plVar9);
      }
      else {
        plVar12 = plVar3 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const**,std::vector<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::BuildEngineImpl::dumpGraphToFile(std::__cxx11::string_const&)::_lambda((anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*)_1_>>
                  (plVar3,plVar12);
        for (; plVar12 != plVar9; plVar12 = plVar12 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const**,std::vector<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::BuildEngineImpl::dumpGraphToFile(std::__cxx11::string_const&)::_lambda((anonymous_namespace)::BuildEngineImpl::RuleInfo_const*,(anonymous_namespace)::BuildEngineImpl::RuleInfo_const*)_1_>>
                    (plVar12);
        }
      }
      for (; plVar10 != plVar9; plVar10 = plVar10 + 1) {
        fprintf(__s,"\"%s\"\n",*(undefined8 *)(*(long *)(*plVar10 + 8) + 8));
        lVar2 = *plVar10;
        lVar14 = *(long *)(lVar2 + 0x50) - *(long *)(lVar2 + 0x48);
        if (lVar14 != 0) {
          lVar8 = 0;
          do {
            pRVar5 = anon_unknown.dwarf_2adb13::BuildEngineImpl::getRuleInfoForKey
                               (this_00,(KeyID)*(ValueTy *)(*(long *)(lVar2 + 0x48) + lVar8 * 8));
            fprintf(__s,"\"%s\" -> \"%s\"\n",*(undefined8 *)(*(long *)(*plVar10 + 8) + 8),
                    (pointer)(((pRVar5->rule)._M_t.
                               super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                               .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl)->
                             key).key._M_dataplus);
            lVar8 = lVar8 + 1;
          } while (lVar14 >> 3 != lVar8);
        }
        fputc(10,__s);
      }
    }
    fwrite("}\n",2,1,__s);
    fclose(__s);
    if (plVar3 != (long *)0x0) {
      operator_delete(plVar3,(long)local_a8 - (long)plVar3);
      return;
    }
  }
  return;
}

Assistant:

void BuildEngine::dumpGraphToFile(const std::string& path) {
  static_cast<BuildEngineImpl*>(impl)->dumpGraphToFile(path);
}